

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadhash.cpp
# Opt level: O1

uint64_t SS_AwareHash(uchar *data,uint64_t n,uint64_t hash,uint64_t scale,uint64_t hardener)

{
  int iVar1;
  ulong uVar2;
  uchar uVar3;
  
  uVar2 = n * 2;
  if (uVar2 != 0) {
    uVar3 = '\0';
    do {
      if ((uVar2 & 1) == 0) {
        uVar3 = *data;
        data = data + 1;
      }
      iVar1 = ((uint)uVar2 & 1) << 2;
      hash = hash * scale + (long)(((int)(char)uVar3 >> iVar1) % (0x10 << iVar1));
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return hash ^ hardener;
}

Assistant:

uint64_t SS_AwareHash(unsigned char* data, uint64_t n,
	uint64_t hash, uint64_t scale, uint64_t hardener) {
	n = 2 * n;
	char tmp = 0;
	while (n) {
		hash *= scale;
		if (n % 2 == 0)
			tmp = *data++;
		hash += (tmp >> (n % 2) * 4) % (1 << (n % 2 + 1) * 4);
		n--;
	}
	return hash ^ hardener;
}